

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::fixColumn(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *lp,int j,bool correctIdx)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  fpclass_type fVar4;
  fpclass_type fVar5;
  pointer pnVar6;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int32_t iVar7;
  int32_t iVar8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  bool bVar13;
  int iVar14;
  int32_t *piVar15;
  FixVariablePS *this_02;
  fpclass_type fVar16;
  undefined7 in_register_00000009;
  long lVar17;
  long lVar18;
  long lVar19;
  pointer pnVar20;
  undefined4 *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  uint *puVar23;
  uint *puVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  undefined4 *puVar26;
  cpp_dec_float<200U,_int,_void> *pcVar27;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  long lVar29;
  long lVar30;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *lp_00;
  long in_FS_OFFSET;
  byte bVar31;
  Real eps;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lo;
  undefined1 local_9e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9e0;
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  uint local_988 [3];
  undefined3 uStack_97b;
  int iStack_978;
  bool bStack_974;
  undefined8 local_970;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_960;
  Item *local_958;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_950;
  long local_948;
  undefined4 local_940;
  int local_93c;
  long local_938;
  undefined8 uStack_930;
  cpp_dec_float<200U,_int,_void> local_928;
  shared_ptr<soplex::Tolerances> local_8a8;
  undefined1 local_898 [32];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [13];
  undefined3 uStack_82b;
  int iStack_828;
  bool bStack_824;
  undefined8 local_820;
  long local_818;
  undefined8 uStack_810;
  long local_800;
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [16];
  undefined1 local_798 [13];
  undefined3 uStack_78b;
  undefined5 uStack_788;
  undefined8 local_780;
  cpp_dec_float<200U,_int,_void> local_778;
  double local_6f8;
  undefined8 uStack_6f0;
  double local_6e8;
  undefined8 uStack_6e0;
  cpp_dec_float<200U,_int,_void> local_6d0;
  uint local_650 [28];
  cpp_dec_float<200U,_int,_void> local_5e0;
  cpp_dec_float<200U,_int,_void> local_560;
  cpp_dec_float<200U,_int,_void> local_4e0;
  cpp_dec_float<200U,_int,_void> local_460;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_360;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e0;
  uint local_260 [28];
  undefined4 local_1f0 [28];
  uint local_180 [28];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar31 = 0;
  local_940 = (int)CONCAT71(in_register_00000009,correctIdx);
  local_93c = j;
  lVar29 = (long)j;
  pnVar6 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar23 = (uint *)(pnVar6 + lVar29);
  pcVar22 = &local_460;
  for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
    (pcVar22->data)._M_elems[0] = *puVar23;
    puVar23 = puVar23 + 1;
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((pcVar22->data)._M_elems + 1);
  }
  local_6d0.exp = pnVar6[lVar29].m_backend.exp;
  local_460.exp = local_6d0.exp;
  local_6d0.neg = pnVar6[lVar29].m_backend.neg;
  local_460.neg = local_6d0.neg;
  local_6d0.fpclass = pnVar6[lVar29].m_backend.fpclass;
  local_460.fpclass = local_6d0.fpclass;
  local_6d0.prec_elem = pnVar6[lVar29].m_backend.prec_elem;
  local_460.prec_elem = local_6d0.prec_elem;
  pnVar6 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar23 = (uint *)(pnVar6 + lVar29);
  puVar24 = local_650;
  for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
    *puVar24 = *puVar23;
    puVar23 = puVar23 + 1;
    puVar24 = puVar24 + 1;
  }
  iVar14 = pnVar6[lVar29].m_backend.exp;
  bVar13 = pnVar6[lVar29].m_backend.neg;
  fVar16 = pnVar6[lVar29].m_backend.fpclass;
  local_800 = lVar29 * 0x80;
  iVar2 = pnVar6[lVar29].m_backend.prec_elem;
  local_960 = lp;
  local_958 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar29].idx;
  pcVar22 = &local_460;
  pcVar27 = &local_6d0;
  for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
    (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((pcVar22->data)._M_elems + 1);
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
  }
  pcVar22 = &local_460;
  puVar23 = (uint *)&local_2e0;
  for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
    *puVar23 = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((pcVar22->data)._M_elems + 1);
    puVar23 = puVar23 + 1;
  }
  local_2e0.m_backend.exp = local_6d0.exp;
  local_2e0.m_backend.neg = local_6d0.neg;
  local_2e0.m_backend.fpclass = local_6d0.fpclass;
  local_2e0.m_backend.prec_elem = local_6d0.prec_elem;
  puVar23 = local_650;
  puVar24 = (uint *)&local_360;
  for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
    *puVar24 = *puVar23;
    puVar23 = puVar23 + 1;
    puVar24 = puVar24 + 1;
  }
  local_938 = CONCAT71(local_938._1_7_,bVar13);
  this_00 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_950 = this;
  local_360.m_backend.exp = iVar14;
  local_360.m_backend.neg = bVar13;
  local_360.m_backend.fpclass = fVar16;
  local_360.m_backend.prec_elem = iVar2;
  eps = Tolerances::epsilon(this_00);
  bVar13 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                     (&local_2e0,&local_360,eps);
  lp_00 = local_960;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (bVar13) {
    puVar23 = local_650;
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_898;
    for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
      (pcVar22->data)._M_elems[0] = *puVar23;
      puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
    }
    bStack_824 = (bool)(byte)local_938;
    local_820 = CONCAT44(iVar2,fVar16);
    iStack_828 = iVar14;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              ((cpp_dec_float<200U,_int,_void> *)local_898,&local_460);
    local_928.fpclass = cpp_dec_float_finite;
    local_928.prec_elem = 0x1c;
    local_928.data._M_elems[0] = 0;
    local_928.data._M_elems[1] = 0;
    local_928.data._M_elems[2] = 0;
    local_928.data._M_elems[3] = 0;
    local_928.data._M_elems[4] = 0;
    local_928.data._M_elems[5] = 0;
    local_928.data._M_elems[6] = 0;
    local_928.data._M_elems[7] = 0;
    local_928.data._M_elems[8] = 0;
    local_928.data._M_elems[9] = 0;
    local_928.data._M_elems[10] = 0;
    local_928.data._M_elems[0xb] = 0;
    local_928.data._M_elems[0xc] = 0;
    local_928.data._M_elems[0xd] = 0;
    local_928.data._M_elems[0xe] = 0;
    local_928.data._M_elems[0xf] = 0;
    local_928.data._M_elems[0x10] = 0;
    local_928.data._M_elems[0x11] = 0;
    local_928.data._M_elems[0x12] = 0;
    local_928.data._M_elems[0x13] = 0;
    local_928.data._M_elems[0x14] = 0;
    local_928.data._M_elems[0x15] = 0;
    local_928.data._M_elems[0x16] = 0;
    local_928.data._M_elems[0x17] = 0;
    local_928.data._M_elems[0x18] = 0;
    local_928.data._M_elems[0x19] = 0;
    local_928.data._M_elems._104_5_ = 0;
    local_928.data._M_elems[0x1b]._1_3_ = 0;
    local_928.exp = 0;
    local_928.neg = false;
    local_970._0_4_ = cpp_dec_float_finite;
    local_970._4_4_ = 0x1c;
    _local_9e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  )ZEXT816(0);
    local_9d8 = ZEXT816(0);
    local_9c8 = ZEXT816(0);
    local_9b8 = ZEXT816(0);
    local_9a8 = ZEXT816(0);
    local_998 = ZEXT816(0);
    local_988[0] = 0;
    local_988[1] = 0;
    stack0xfffffffffffff680 = 0;
    uStack_97b = 0;
    iStack_978 = 0;
    bStack_974 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_9e8,2.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_928,(cpp_dec_float<200U,_int,_void> *)local_898,
               (cpp_dec_float<200U,_int,_void> *)local_9e8);
    pcVar22 = &local_928;
    pcVar27 = &local_6d0;
    for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
      (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar31 * -2 + 1) * 4);
    }
    local_6d0.exp = local_928.exp;
    local_6d0.neg = local_928.neg;
    local_6d0.fpclass = local_928.fpclass;
    local_6d0.prec_elem = local_928.prec_elem;
  }
  bVar13 = local_460.neg;
  iVar14 = local_460.exp;
  pcVar22 = &local_460;
  puVar23 = local_a0;
  for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
    *puVar23 = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar31 * -2 + 1) * 4);
    puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
  }
  lVar17 = CONCAT44(local_460.prec_elem,local_460.fpclass);
  uStack_930 = 0;
  local_938 = lVar17;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_4e0,local_950);
  puVar23 = local_a0;
  puVar24 = (uint *)local_9e8;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    *puVar24 = *puVar23;
    puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
    puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
  }
  iStack_978 = iVar14;
  bStack_974 = bVar13;
  if ((bVar13 == true) && (local_9e8._0_4_ != 0 || (int)local_938 != 0)) {
    bStack_974 = false;
  }
  local_970 = lVar17;
  if (((((int)local_938 != 2) && (local_4e0.fpclass != cpp_dec_float_NaN)) &&
      (iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_9e8,&local_4e0), 0 < iVar14)) &&
     (0 < (local_958->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused)) {
    local_6e8 = *(double *)(in_FS_OFFSET + -8);
    uStack_6e0 = 0;
    local_6f8 = -local_6e8;
    uStack_6f0 = 0x8000000000000000;
    lVar29 = 0;
    lVar17 = 0;
    do {
      lVar30 = (long)*(int *)((long)(&((local_958->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar29);
      pcVar22 = &(lp_00->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
      local_938 = lVar30;
      ::soplex::infinity::__tls_init();
      local_970 = 0x1c00000000;
      local_9e8 = (undefined1  [8])0x0;
      _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_9d8 = (undefined1  [16])0x0;
      local_9c8 = (undefined1  [16])0x0;
      local_9b8 = (undefined1  [16])0x0;
      local_9a8 = (undefined1  [16])0x0;
      local_998 = (undefined1  [16])0x0;
      local_988[0] = 0;
      local_988[1] = 0;
      stack0xfffffffffffff680 = 0;
      uStack_97b = 0;
      iStack_978 = 0;
      bStack_974 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_9e8,local_6e8);
      if (((pcVar22->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_970 != cpp_dec_float_NaN)
          ) && (iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (pcVar22,(cpp_dec_float<200U,_int,_void> *)local_9e8), iVar14 < 0
               )) {
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(((local_958->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .m_elem)->val).m_backend.data._M_elems + lVar29);
        local_820 = 0x1c00000000;
        local_898._0_16_ = (undefined1  [16])0x0;
        local_898._16_16_ = (undefined1  [16])0x0;
        local_878 = (undefined1  [16])0x0;
        local_868 = (undefined1  [16])0x0;
        local_858 = (undefined1  [16])0x0;
        local_848 = (undefined1  [16])0x0;
        local_838 = SUB1613((undefined1  [16])0x0,0);
        uStack_82b = 0;
        iStack_828 = 0;
        bStack_824 = false;
        pcVar22 = &local_6d0;
        if (pcVar27 != (cpp_dec_float<200U,_int,_void> *)local_898) {
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_898;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
          }
          iStack_828 = local_6d0.exp;
          bStack_824 = local_6d0.neg;
          local_820._0_4_ = local_6d0.fpclass;
          local_820._4_4_ = local_6d0.prec_elem;
          pcVar22 = pcVar27;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_898,pcVar22);
        lVar18 = local_820;
        bVar13 = bStack_824;
        iVar14 = iStack_828;
        pnVar6 = (lp_00->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar20 = pnVar6 + lVar30;
        puVar23 = local_110;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *puVar23 = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar31 * -2 + 1) * 4);
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        }
        iVar3 = pnVar6[lVar30].m_backend.exp;
        bVar1 = pnVar6[lVar30].m_backend.neg;
        fVar4 = pnVar6[lVar30].m_backend.fpclass;
        iVar7 = pnVar6[lVar30].m_backend.prec_elem;
        puVar23 = local_110;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
        }
        iStack_978 = iVar3;
        bStack_974 = bVar1;
        local_970._0_4_ = fVar4;
        local_970._4_4_ = iVar7;
        if ((bVar1 == true) && (local_9e8._0_4_ != 0 || fVar4 != cpp_dec_float_finite)) {
          bStack_974 = false;
        }
        puVar23 = (uint *)local_898;
        pcVar22 = &local_928;
        for (lVar19 = 0x1c; lVar12 = local_820, lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
        }
        local_928.exp = iVar14;
        local_928.neg = bVar13;
        local_820._0_4_ = (undefined4)lVar18;
        local_820._4_4_ = SUB84(lVar18,4);
        local_928.fpclass = (undefined4)local_820;
        local_928.prec_elem = local_820._4_4_;
        fVar16 = (fpclass_type)lVar18;
        if ((bVar13 != false) && (fVar16 != cpp_dec_float_finite || local_928.data._M_elems[0] != 0)
           ) {
          local_928.neg = (bool)(bVar13 ^ 1);
        }
        local_820 = lVar12;
        if (fVar16 == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) {
LAB_00575783:
          local_970._0_4_ = fVar16;
          pcVar22 = &local_928;
          pcVar27 = &local_778;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar27 + ((ulong)bVar31 * -2 + 1) * 4);
          }
          local_778.exp = local_928.exp;
          local_778.neg = local_928.neg;
          piVar15 = &local_928.prec_elem;
        }
        else {
          iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_9e8,&local_928);
          if (iVar14 < 1) {
            fVar16 = local_928.fpclass;
            goto LAB_00575783;
          }
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
          pcVar27 = &local_778;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar27 + ((ulong)bVar31 * -2 + 1) * 4);
          }
          local_778.exp = iStack_978;
          local_778.neg = bStack_974;
          piVar15 = (int32_t *)((long)&local_970 + 4);
        }
        local_948 = lVar17;
        local_778.fpclass = (fpclass_type)local_970;
        local_778.prec_elem = *piVar15;
        if ((fpclass_type)local_970 != cpp_dec_float_NaN) {
          local_970._0_4_ = cpp_dec_float_finite;
          local_970._4_4_ = 0x1c;
          local_9e8 = (undefined1  [8])0x0;
          _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_9d8 = (undefined1  [16])0x0;
          local_9c8 = (undefined1  [16])0x0;
          local_9b8 = (undefined1  [16])0x0;
          local_9a8 = (undefined1  [16])0x0;
          local_998 = (undefined1  [16])0x0;
          local_988[0] = 0;
          local_988[1] = 0;
          stack0xfffffffffffff680 = 0;
          uStack_97b = 0;
          iStack_978 = 0;
          bStack_974 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_9e8,1.0);
          iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_778,(cpp_dec_float<200U,_int,_void> *)local_9e8);
          if (iVar14 < 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_778,1.0);
          }
        }
        local_970 = 0x1c00000000;
        local_9e8 = (undefined1  [8])0x0;
        _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_9d8 = (undefined1  [16])0x0;
        local_9c8 = (undefined1  [16])0x0;
        local_9b8 = (undefined1  [16])0x0;
        local_9a8 = (undefined1  [16])0x0;
        local_998 = (undefined1  [16])0x0;
        local_988[0] = 0;
        local_988[1] = 0;
        stack0xfffffffffffff680 = 0;
        uStack_97b = 0;
        iStack_978 = 0;
        bStack_974 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_9e8,
                   &(lp_00->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend,&local_778);
        local_780._0_4_ = cpp_dec_float_finite;
        local_780._4_4_ = 0x1c;
        local_7f8 = (undefined1  [16])0x0;
        local_7e8 = (undefined1  [16])0x0;
        local_7d8 = (undefined1  [16])0x0;
        local_7c8 = (undefined1  [16])0x0;
        local_7b8 = (undefined1  [16])0x0;
        local_7a8 = (undefined1  [16])0x0;
        local_798 = SUB1613((undefined1  [16])0x0,0);
        uStack_78b = 0;
        uStack_788._0_4_ = 0;
        uStack_788._4_1_ = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_7f8,
                   (cpp_dec_float<200U,_int,_void> *)local_898,&local_778);
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
        pcVar27 = &local_928;
        for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
        }
        local_928.exp = iStack_978;
        local_928.neg = bStack_974;
        local_928.fpclass = (fpclass_type)local_970;
        local_928.prec_elem = local_970._4_4_;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_928,(cpp_dec_float<200U,_int,_void> *)local_7f8);
        uVar10 = local_928._120_8_;
        bVar13 = local_928.neg;
        iVar14 = local_928.exp;
        pcVar22 = &local_928;
        puVar23 = local_180;
        for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
          *puVar23 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        }
        local_818._0_4_ = local_928.fpclass;
        local_818._4_4_ = local_928.prec_elem;
        uStack_810 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_560,local_950);
        puVar23 = local_180;
        puVar24 = (uint *)local_9e8;
        for (lVar18 = 0x1c; uVar11 = local_928._120_8_, lVar17 = local_948, lVar18 != 0;
            lVar18 = lVar18 + -1) {
          *puVar24 = *puVar23;
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
        }
        iStack_978 = iVar14;
        bStack_974 = bVar13;
        local_928.fpclass = (fpclass_type)uVar10;
        local_928.prec_elem = SUB84(uVar10,4);
        local_970._0_4_ = local_928.fpclass;
        local_970._4_4_ = local_928.prec_elem;
        if ((bVar13 == true) && (local_9e8._0_4_ != 0 || (int)local_818 != 0)) {
          bStack_974 = false;
        }
        local_928._120_8_ = uVar11;
        if ((((int)local_818 == 2) || (local_560.fpclass == cpp_dec_float_NaN)) ||
           (iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_9e8,&local_560),
           lp_00 = local_960, 0 < iVar14)) {
          lp_00 = local_960;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_928,&local_778);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_928,0.0);
        }
        (*(lp_00->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(lp_00,local_938,&local_928,0);
      }
      pcVar22 = &(lp_00->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
      ::soplex::infinity::__tls_init();
      local_970 = 0x1c00000000;
      local_9e8 = (undefined1  [8])0x0;
      _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_9d8 = (undefined1  [16])0x0;
      local_9c8 = (undefined1  [16])0x0;
      local_9b8 = (undefined1  [16])0x0;
      local_9a8 = (undefined1  [16])0x0;
      local_998 = (undefined1  [16])0x0;
      local_988[0] = 0;
      local_988[1] = 0;
      stack0xfffffffffffff680 = 0;
      uStack_97b = 0;
      iStack_978 = 0;
      bStack_974 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_9e8,local_6f8);
      if (((pcVar22->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_970 != cpp_dec_float_NaN)
          ) && (iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (pcVar22,(cpp_dec_float<200U,_int,_void> *)local_9e8), 0 < iVar14
               )) {
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(((local_958->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .m_elem)->val).m_backend.data._M_elems + lVar29);
        local_820 = 0x1c00000000;
        local_898._0_16_ = (undefined1  [16])0x0;
        local_898._16_16_ = (undefined1  [16])0x0;
        local_878 = (undefined1  [16])0x0;
        local_868 = (undefined1  [16])0x0;
        local_858 = (undefined1  [16])0x0;
        local_848 = (undefined1  [16])0x0;
        local_838 = SUB1613((undefined1  [16])0x0,0);
        uStack_82b = 0;
        iStack_828 = 0;
        bStack_824 = false;
        pcVar22 = &local_6d0;
        if (pcVar27 != (cpp_dec_float<200U,_int,_void> *)local_898) {
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_898;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
          }
          iStack_828 = local_6d0.exp;
          bStack_824 = local_6d0.neg;
          local_820._0_4_ = local_6d0.fpclass;
          local_820._4_4_ = local_6d0.prec_elem;
          pcVar22 = pcVar27;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_898,pcVar22);
        lVar18 = local_820;
        bVar13 = bStack_824;
        iVar14 = iStack_828;
        pnVar6 = (lp_00->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar20 = pnVar6 + lVar30;
        puVar21 = local_1f0;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *puVar21 = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar31 * -2 + 1) * 4);
          puVar21 = puVar21 + (ulong)bVar31 * -2 + 1;
        }
        iVar3 = pnVar6[lVar30].m_backend.exp;
        bVar1 = pnVar6[lVar30].m_backend.neg;
        fVar5 = pnVar6[lVar30].m_backend.fpclass;
        iVar8 = pnVar6[lVar30].m_backend.prec_elem;
        puVar21 = local_1f0;
        puVar26 = (undefined4 *)local_9e8;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *puVar26 = *puVar21;
          puVar21 = puVar21 + (ulong)bVar31 * -2 + 1;
          puVar26 = puVar26 + (ulong)bVar31 * -2 + 1;
        }
        iStack_978 = iVar3;
        bStack_974 = bVar1;
        local_970._0_4_ = fVar5;
        local_970._4_4_ = iVar8;
        if ((bVar1 == true) && (local_9e8._0_4_ != 0 || fVar5 != cpp_dec_float_finite)) {
          bStack_974 = false;
        }
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_898;
        pcVar27 = &local_928;
        for (lVar19 = 0x1c; lVar12 = local_820, lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
        }
        local_928.exp = iVar14;
        local_928.neg = bVar13;
        local_820._0_4_ = (undefined4)lVar18;
        local_820._4_4_ = SUB84(lVar18,4);
        local_928.fpclass = (undefined4)local_820;
        local_928.prec_elem = local_820._4_4_;
        fVar16 = (fpclass_type)lVar18;
        if ((bVar13 != false) && (fVar16 != cpp_dec_float_finite || local_928.data._M_elems[0] != 0)
           ) {
          local_928.neg = (bool)(bVar13 ^ 1);
        }
        local_820 = lVar12;
        if (fVar16 == cpp_dec_float_NaN || fVar5 == cpp_dec_float_NaN) {
LAB_00575d59:
          local_970._0_4_ = fVar16;
          pcVar22 = &local_928;
          pcVar27 = &local_778;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
          }
          local_778.exp = local_928.exp;
          local_778.neg = local_928.neg;
          piVar15 = &local_928.prec_elem;
        }
        else {
          iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_9e8,&local_928);
          if (iVar14 < 1) {
            fVar16 = local_928.fpclass;
            goto LAB_00575d59;
          }
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
          pcVar27 = &local_778;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
          }
          local_778.exp = iStack_978;
          local_778.neg = bStack_974;
          piVar15 = (int32_t *)((long)&local_970 + 4);
        }
        local_948 = lVar17;
        local_778.fpclass = (fpclass_type)local_970;
        local_778.prec_elem = *piVar15;
        if ((fpclass_type)local_970 != cpp_dec_float_NaN) {
          local_970._0_4_ = cpp_dec_float_finite;
          local_970._4_4_ = 0x1c;
          local_9e8 = (undefined1  [8])0x0;
          _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_9d8 = (undefined1  [16])0x0;
          local_9c8 = (undefined1  [16])0x0;
          local_9b8 = (undefined1  [16])0x0;
          local_9a8 = (undefined1  [16])0x0;
          local_998 = (undefined1  [16])0x0;
          local_988[0] = 0;
          local_988[1] = 0;
          stack0xfffffffffffff680 = 0;
          uStack_97b = 0;
          iStack_978 = 0;
          bStack_974 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_9e8,1.0);
          iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_778,(cpp_dec_float<200U,_int,_void> *)local_9e8);
          if (iVar14 < 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_778,1.0);
          }
        }
        local_970 = 0x1c00000000;
        local_9e8 = (undefined1  [8])0x0;
        _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_9d8 = (undefined1  [16])0x0;
        local_9c8 = (undefined1  [16])0x0;
        local_9b8 = (undefined1  [16])0x0;
        local_9a8 = (undefined1  [16])0x0;
        local_998 = (undefined1  [16])0x0;
        local_988[0] = 0;
        local_988[1] = 0;
        stack0xfffffffffffff680 = 0;
        uStack_97b = 0;
        iStack_978 = 0;
        bStack_974 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_9e8,
                   &(lp_00->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend,&local_778);
        local_780._0_4_ = cpp_dec_float_finite;
        local_780._4_4_ = 0x1c;
        local_7f8 = (undefined1  [16])0x0;
        local_7e8 = (undefined1  [16])0x0;
        local_7d8 = (undefined1  [16])0x0;
        local_7c8 = (undefined1  [16])0x0;
        local_7b8 = (undefined1  [16])0x0;
        local_7a8 = (undefined1  [16])0x0;
        local_798 = SUB1613((undefined1  [16])0x0,0);
        uStack_78b = 0;
        uStack_788._0_4_ = 0;
        uStack_788._4_1_ = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_7f8,
                   (cpp_dec_float<200U,_int,_void> *)local_898,&local_778);
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
        pcVar27 = &local_928;
        for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
        }
        local_928.exp = iStack_978;
        local_928.neg = bStack_974;
        local_928.fpclass = (fpclass_type)local_970;
        local_928.prec_elem = local_970._4_4_;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_928,(cpp_dec_float<200U,_int,_void> *)local_7f8);
        uVar10 = local_928._120_8_;
        bVar13 = local_928.neg;
        iVar14 = local_928.exp;
        pcVar22 = &local_928;
        puVar23 = local_260;
        for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
          *puVar23 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        }
        local_818._0_4_ = local_928.fpclass;
        local_818._4_4_ = local_928.prec_elem;
        uStack_810 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_5e0,local_950);
        puVar23 = local_260;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
        for (lVar30 = 0x1c; uVar11 = local_928._120_8_, lVar17 = local_948, lVar30 != 0;
            lVar30 = lVar30 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
        }
        iStack_978 = iVar14;
        bStack_974 = bVar13;
        local_928.fpclass = (fpclass_type)uVar10;
        local_928.prec_elem = SUB84(uVar10,4);
        local_970._0_4_ = local_928.fpclass;
        local_970._4_4_ = local_928.prec_elem;
        if ((bVar13 == true) && (local_9e8._0_4_ != 0 || (int)local_818 != 0)) {
          bStack_974 = false;
        }
        local_928._120_8_ = uVar11;
        if (((int)local_818 == 2) || (local_5e0.fpclass == cpp_dec_float_NaN)) {
LAB_0057603a:
          lp_00 = local_960;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_928,&local_778);
        }
        else {
          iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_9e8,&local_5e0);
          lp_00 = local_960;
          if (0 < iVar14) goto LAB_0057603a;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_928,0.0);
        }
        (*(lp_00->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])(lp_00,local_938,&local_928,0);
      }
      lVar17 = lVar17 + 1;
      lVar29 = lVar29 + 0x84;
    } while (lVar17 < (local_958->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  this_02 = (FixVariablePS *)operator_new(600);
  pSVar9 = local_950;
  pnVar6 = (lp_00->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar23 = (uint *)((long)(pnVar6->m_backend).data._M_elems + local_800);
  pnVar28 = &local_3e0;
  for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
    (pnVar28->m_backend).data._M_elems[0] = *puVar23;
    puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
    pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar28 + ((ulong)bVar31 * -2 + 1) * 4);
  }
  local_3e0.m_backend.exp = *(int *)((long)(&(pnVar6->m_backend).data + 1) + local_800);
  local_3e0.m_backend.neg = *(bool *)((long)(&(pnVar6->m_backend).data + 1) + local_800 + 4U);
  local_3e0.m_backend._120_8_ =
       *(undefined8 *)((long)(&(pnVar6->m_backend).data + 1) + local_800 + 8U);
  local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (local_950->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (local_950->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  FixVariablePS::FixVariablePS
            (this_02,lp_00,local_950,local_93c,&local_3e0,&local_8a8,SUB41(local_940,0));
  local_9e8 = (undefined1  [8])this_02;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_9e8 + 8),this_02);
  if (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(pSVar9->m_hist).data,(value_type *)local_9e8);
  if (_Stack_9e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_9e0._M_pi);
  }
  return;
}

Assistant:

void SPxMainSM<R>::fixColumn(SPxLPBase<R>& lp, int j, bool correctIdx)
{

   assert(EQrel(lp.lower(j), lp.upper(j), feastol()));

   R lo            = lp.lower(j);
   R up            = lp.upper(j);
   const SVectorBase<R>& col = lp.colVector(j);
   R mid           = lo;

   // use the center value between slightly different bounds to improve numerics
   if(NE(lo, up, this->tolerances()->epsilon()))
      mid = (up + lo) / 2.0;

   assert(lo < R(infinity) && lo > R(-infinity));
   assert(up < R(infinity) && up > R(-infinity));

   SPxOut::debug(this, "IMAISM66 fix variable x{}: lower={} upper={} to new value: {}\n", j, lo, up,
                 mid);

   if(isNotZero(lo, this->epsZero()))
   {
      for(int k = 0; k < col.size(); ++k)
      {
         int i = col.index(k);

         if(lp.rhs(i) < R(infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.rhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R rhs = (lp.rhs(i) / scale) - (y / scale);

            if(isZero(rhs, this->epsZero()))
               rhs = 0.0;
            else
               rhs *= scale;

            SPxOut::debug(this, "IMAISM67 row {}: rhs={} ({}) aij={}\n", i, rhs, lp.rhs(i), col.value(k));

            lp.changeRhs(i, rhs);
         }

         if(lp.lhs(i) > R(-infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.lhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R lhs = (lp.lhs(i) / scale) - (y / scale);

            if(isZero(lhs, this->epsZero()))
               lhs = 0.0;
            else
               lhs *= scale;

            SPxOut::debug(this, "IMAISM68 row {}: lhs={} ({}) aij={}\n", i, lhs, lp.lhs(i), col.value(k));

            lp.changeLhs(i, lhs);
         }

         assert(lp.lhs(i) <= lp.rhs(i) + feastol());
      }
   }

   std::shared_ptr<PostStep> ptr(new FixVariablePS(lp, *this, j, lp.lower(j), this->_tolerances,
                                 correctIdx));
   m_hist.append(ptr);
}